

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O0

st_neverbleed_thread_data_t * get_thread_data(neverbleed_t *nb)

{
  __pid_t _Var1;
  int iVar2;
  int *piVar3;
  ssize_t sVar4;
  bool bVar5;
  ssize_t r;
  st_neverbleed_thread_data_t *psStack_20;
  pid_t self_pid;
  st_neverbleed_thread_data_t *thdata;
  neverbleed_t *nb_local;
  
  _Var1 = getpid();
  psStack_20 = (st_neverbleed_thread_data_t *)pthread_getspecific(nb->thread_key);
  if (psStack_20 == (st_neverbleed_thread_data_t *)0x0) {
    psStack_20 = (st_neverbleed_thread_data_t *)malloc(8);
    if (psStack_20 == (st_neverbleed_thread_data_t *)0x0) {
      dief("malloc failed");
    }
  }
  else {
    if (psStack_20->self_pid == _Var1) {
      return psStack_20;
    }
    close(psStack_20->fd);
  }
  psStack_20->self_pid = _Var1;
  iVar2 = socket(1,0x80001,0);
  psStack_20->fd = iVar2;
  if (iVar2 == -1) {
    dief("socket(2) failed");
  }
  while (iVar2 = connect(psStack_20->fd,(sockaddr *)&nb->sun_,0x6e), iVar2 != 0) {
    piVar3 = __errno_location();
    if (*piVar3 != 4) {
      dief("failed to connect to privsep daemon");
    }
  }
  do {
    sVar4 = write(psStack_20->fd,nb->auth_token,0x20);
    bVar5 = false;
    if (sVar4 == -1) {
      piVar3 = __errno_location();
      bVar5 = *piVar3 == 4;
    }
  } while (bVar5);
  if (sVar4 == 0x20) {
    pthread_setspecific(nb->thread_key,psStack_20);
    return psStack_20;
  }
  dief("failed to send authentication token");
}

Assistant:

struct st_neverbleed_thread_data_t *get_thread_data(neverbleed_t *nb)
{
    struct st_neverbleed_thread_data_t *thdata;
    pid_t self_pid = getpid();
    ssize_t r;

    if ((thdata = pthread_getspecific(nb->thread_key)) != NULL) {
        if (thdata->self_pid == self_pid)
            return thdata;
        /* we have been forked! */
        close(thdata->fd);
    } else {
        if ((thdata = malloc(sizeof(*thdata))) == NULL)
            dief("malloc failed");
    }

    thdata->self_pid = self_pid;
#ifdef SOCK_CLOEXEC
    if ((thdata->fd = socket(PF_UNIX, SOCK_STREAM | SOCK_CLOEXEC, 0)) == -1)
        dief("socket(2) failed");
#else
    if ((thdata->fd = socket(PF_UNIX, SOCK_STREAM, 0)) == -1)
        dief("socket(2) failed");
    set_cloexec(thdata->fd);
#endif
    while (connect(thdata->fd, (void *)&nb->sun_, sizeof(nb->sun_)) != 0)
        if (errno != EINTR)
            dief("failed to connect to privsep daemon");
    while ((r = write(thdata->fd, nb->auth_token, sizeof(nb->auth_token))) == -1 && errno == EINTR)
        ;
    if (r != sizeof(nb->auth_token))
        dief("failed to send authentication token");
    pthread_setspecific(nb->thread_key, thdata);

    return thdata;
}